

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample03.cpp
# Opt level: O0

PyObject * PyInit_sample03(void)

{
  PyObject *pPVar1;
  class_<Job,std::shared_ptr<Job>> *this;
  class_<Person,std::shared_ptr<Person>> *pcVar2;
  PyObject **ppPVar3;
  cpp_function local_b0;
  code *local_a8;
  undefined8 local_a0;
  code *local_98;
  undefined8 local_90;
  cpp_function local_88;
  code *local_80;
  undefined8 local_78;
  init<> local_69;
  handle local_68;
  class_<Person,_std::shared_ptr<Person>_> local_60;
  class_<Person,_std::shared_ptr<Person>_> person;
  cpp_function local_48;
  code *local_40;
  undefined8 local_38;
  init<> local_2d [13];
  handle local_20;
  class_<Job,_std::shared_ptr<Job>_> local_18;
  class_<Job,_std::shared_ptr<Job>_> job;
  module m;
  
  pybind11::module::module((module *)&job,"sample03","pybind11 module sample.");
  local_20.m_ptr = (PyObject *)job.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::class_<Job,_std::shared_ptr<Job>_>::class_<>
            (&local_18,(handle)job.super_generic_type.super_object.super_handle.m_ptr,"Job");
  pybind11::init<>();
  this = (class_<Job,std::shared_ptr<Job>> *)
         pybind11::class_<Job,_std::shared_ptr<Job>_>::def<>(&local_18,local_2d);
  local_40 = Job::GetName_abi_cxx11_;
  local_38 = 0;
  person.super_generic_type.super_object.super_handle.m_ptr = (generic_type)Job::SetName;
  pybind11::cpp_function::cpp_function<void,Job,std::__cxx11::string_const&>(&local_48,0x106ed0);
  pybind11::class_<Job,std::shared_ptr<Job>>::def_property<std::__cxx11::string(Job::*)()const>
            (this,"name",(offset_in_Job_to_subr *)&local_40,&local_48);
  pybind11::cpp_function::~cpp_function(&local_48);
  local_68.m_ptr = (PyObject *)job.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::class_<Person,_std::shared_ptr<Person>_>::class_<>
            (&local_60,(handle)job.super_generic_type.super_object.super_handle.m_ptr,"Person");
  pybind11::init<>();
  pcVar2 = (class_<Person,std::shared_ptr<Person>> *)
           pybind11::class_<Person,_std::shared_ptr<Person>_>::def<>(&local_60,&local_69);
  local_80 = Person::GetName_abi_cxx11_;
  local_78 = 0;
  local_98 = Person::SetName;
  local_90 = 0;
  pybind11::cpp_function::cpp_function<void,Person,std::__cxx11::string_const&>(&local_88,0x1071a0);
  pcVar2 = (class_<Person,std::shared_ptr<Person>> *)
           pybind11::class_<Person,std::shared_ptr<Person>>::
           def_property<std::__cxx11::string(Person::*)()const>
                     (pcVar2,"name",(offset_in_Job_to_subr *)&local_80,&local_88);
  local_a8 = Person::GetJob;
  local_a0 = 0;
  pybind11::cpp_function::cpp_function<void,Person,std::shared_ptr<Job>const&>(&local_b0,0x107330);
  pybind11::class_<Person,std::shared_ptr<Person>>::
  def_property<std::shared_ptr<Job>(Person::*)()const>
            (pcVar2,"job",(offset_in_Job_to_subr *)&local_a8,&local_b0);
  pybind11::cpp_function::~cpp_function(&local_b0);
  pybind11::cpp_function::~cpp_function(&local_88);
  ppPVar3 = pybind11::handle::ptr((handle *)&job);
  pPVar1 = *ppPVar3;
  pybind11::class_<Person,_std::shared_ptr<Person>_>::~class_(&local_60);
  pybind11::class_<Job,_std::shared_ptr<Job>_>::~class_(&local_18);
  pybind11::module::~module((module *)&job);
  return pPVar1;
}

Assistant:

PyMODINIT_FUNC PyInit_sample03() {
	py::module m("sample03", "pybind11 module sample.");

	py::class_<Job, std::shared_ptr<Job>> job(m, "Job");
	job.def(py::init<>()).def_property("name", &Job::GetName, &Job::SetName);

	py::class_<Person, std::shared_ptr<Person>> person(m, "Person");
	person.def(py::init<>())
		.def_property("name", &Person::GetName, &Person::SetName)
		.def_property("job", &Person::GetJob, &Person::SetJob);

	return m.ptr();
}